

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

int gtStripSeparate(TIFFRGBAImage *img,uint32_t *raster,uint32_t w,uint32_t h)

{
  int iVar1;
  undefined1 auVar2 [16];
  tileSeparateRoutine p_Var3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  tmsize_t second;
  tmsize_t bufsizetoalloc;
  char *pcVar8;
  tmsize_t tVar9;
  uint uVar10;
  int local_1bc;
  uchar *local_1b8;
  uchar *local_148;
  uchar *local_140;
  int local_120;
  int local_118;
  uint32_t *puStack_100;
  uint32_t temp_1;
  uint32_t *right;
  uint32_t *left;
  uint32_t line;
  tmsize_t roffset;
  ushort local_d6;
  uint32_t temp;
  int iStack_d0;
  uint16_t colorchannels;
  int flip;
  int ret;
  int alpha;
  int32_t toskew;
  int32_t fromskew;
  tmsize_t bufsize;
  tmsize_t stripsize;
  uint32_t imagewidth;
  uint32_t offset_row;
  uint32_t rowsperstrip;
  tmsize_t scanline;
  tmsize_t pos;
  uint32_t rowstoread;
  uint32_t nrow;
  uint32_t y;
  uint32_t row;
  uchar *pa;
  uchar *p2;
  uchar *p1;
  uchar *p0;
  uchar *buf;
  tileSeparateRoutine put;
  TIFF *tif;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t *raster_local;
  TIFFRGBAImage *img_local;
  
  put = (tileSeparateRoutine)img->tif;
  buf = (uchar *)(img->put).any;
  p0 = (uchar *)0x0;
  p1 = (uchar *)0x0;
  p2 = (uchar *)0x0;
  pa = (uchar *)0x0;
  _y = (uchar *)0x0;
  uVar10 = img->width;
  iVar1 = img->alpha;
  iStack_d0 = 1;
  tif._0_4_ = h;
  tif._4_4_ = w;
  _h_local = raster;
  raster_local = (uint32_t *)img;
  second = TIFFStripSize((TIFF *)put);
  iVar4 = 3;
  if (iVar1 != 0) {
    iVar4 = 4;
  }
  bufsizetoalloc = _TIFFMultiplySSize((TIFF *)put,(long)iVar4,second,"gtStripSeparate");
  if (bufsizetoalloc == 0) {
    img_local._4_4_ = 0;
  }
  else {
    uVar5 = setorientation((TIFFRGBAImage *)raster_local);
    p_Var3 = put;
    if ((uVar5 & 1) == 0) {
      rowstoread = 0;
      ret = 0;
    }
    else {
      if (0x7fffffff < tif._4_4_) {
        pcVar8 = TIFFFileName((TIFF *)put);
        TIFFErrorExtR((TIFF *)p_Var3,pcVar8,"Width overflow");
        return 0;
      }
      rowstoread = (uint32_t)tif - 1;
      ret = tif._4_4_ * -2;
    }
    if (((ushort)raster_local[9] < 2) || ((ushort)raster_local[9] == 3)) {
      local_d6 = 1;
    }
    else {
      local_d6 = 3;
    }
    TIFFGetFieldDefaulted((TIFF *)put,0x116,&imagewidth);
    _offset_row = TIFFScanlineSize((TIFF *)put);
    if (tif._4_4_ < uVar10) {
      local_118 = uVar10 - tif._4_4_;
    }
    else {
      local_118 = 0;
    }
    for (nrow = 0; p_Var3 = put, nrow < (uint32_t)tif; nrow = pos._4_4_ + nrow) {
      pos._0_4_ = imagewidth - (nrow + raster_local[0x22]) % imagewidth;
      local_120 = (int)pos;
      if ((uint32_t)tif < nrow + (int)pos) {
        local_120 = (uint32_t)tif - nrow;
      }
      pos._4_4_ = local_120;
      uVar6 = nrow + raster_local[0x22];
      uVar10 = (nrow + raster_local[0x22]) % imagewidth + local_120;
      if ((0 < _offset_row) &&
         (auVar2._8_8_ = 0, auVar2._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8),
         SUB168((auVar2 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(_offset_row),0) <
         (ulong)uVar10)) {
        pcVar8 = TIFFFileName((TIFF *)put);
        TIFFErrorExtR((TIFF *)p_Var3,pcVar8,"Integer overflow in gtStripSeparate");
        return 0;
      }
      if (p0 == (uchar *)0x0) {
        uVar7 = TIFFComputeStrip((TIFF *)put,uVar6,0);
        tVar9 = _TIFFReadEncodedStripAndAllocBuffer
                          ((TIFF *)p_Var3,uVar7,&p0,bufsizetoalloc,(ulong)uVar10 * _offset_row);
        if ((tVar9 == -1) && ((p0 == (uchar *)0x0 || (raster_local[2] != 0)))) {
          iStack_d0 = 0;
          break;
        }
        p1 = p0;
        if (local_d6 == 1) {
          p2 = p0;
          pa = p0;
          if (iVar1 == 0) {
            local_140 = (uchar *)0x0;
          }
          else {
            local_140 = p0 + second * 3;
          }
          _y = local_140;
        }
        else {
          p2 = p0 + second;
          pa = p2 + second;
          if (iVar1 == 0) {
            local_148 = (uchar *)0x0;
          }
          else {
            local_148 = pa + second;
          }
          _y = local_148;
        }
      }
      else {
        uVar7 = TIFFComputeStrip((TIFF *)put,uVar6,0);
        tVar9 = TIFFReadEncodedStrip((TIFF *)p_Var3,uVar7,p1,(ulong)uVar10 * _offset_row);
        if ((tVar9 == -1) && (raster_local[2] != 0)) {
          iStack_d0 = 0;
          break;
        }
      }
      p_Var3 = put;
      if (1 < local_d6) {
        uVar7 = TIFFComputeStrip((TIFF *)put,uVar6,1);
        tVar9 = TIFFReadEncodedStrip((TIFF *)p_Var3,uVar7,p2,(ulong)uVar10 * _offset_row);
        if ((tVar9 == -1) && (raster_local[2] != 0)) {
          iStack_d0 = 0;
          break;
        }
      }
      p_Var3 = put;
      if (1 < local_d6) {
        uVar7 = TIFFComputeStrip((TIFF *)put,uVar6,2);
        tVar9 = TIFFReadEncodedStrip((TIFF *)p_Var3,uVar7,pa,(ulong)uVar10 * _offset_row);
        if ((tVar9 == -1) && (raster_local[2] != 0)) {
          iStack_d0 = 0;
          break;
        }
      }
      p_Var3 = put;
      if (iVar1 != 0) {
        uVar6 = TIFFComputeStrip((TIFF *)put,uVar6,local_d6);
        tVar9 = TIFFReadEncodedStrip((TIFF *)p_Var3,uVar6,_y,(ulong)uVar10 * _offset_row);
        if ((tVar9 == -1) && (raster_local[2] != 0)) {
          iStack_d0 = 0;
          break;
        }
      }
      scanline = ((ulong)(nrow + raster_local[0x22]) % (ulong)imagewidth) * _offset_row +
                 (long)(int)raster_local[0x23] * (ulong)*(ushort *)((long)raster_local + 0x1e);
      if (iVar1 == 0) {
        local_1b8 = (uchar *)0x0;
      }
      else {
        local_1b8 = _y + scanline;
      }
      (*(code *)buf)(raster_local,_h_local + (ulong)rowstoread * (ulong)tif._4_4_,0,rowstoread,
                     tif._4_4_,pos._4_4_,local_118,ret,p1 + scanline,p2 + scanline,pa + scanline,
                     local_1b8);
      if ((uVar5 & 1) == 0) {
        local_1bc = pos._4_4_;
      }
      else {
        local_1bc = -pos._4_4_;
      }
      rowstoread = local_1bc + rowstoread;
    }
    if ((uVar5 & 2) != 0) {
      for (left._4_4_ = 0; left._4_4_ < (uint32_t)tif; left._4_4_ = left._4_4_ + 1) {
        right = _h_local + left._4_4_ * tif._4_4_;
        puStack_100 = right + tif._4_4_;
        for (; puStack_100 = puStack_100 + -1, right < puStack_100; right = right + 1) {
          uVar6 = *right;
          *right = *puStack_100;
          *puStack_100 = uVar6;
        }
      }
    }
    _TIFFfreeExt(*(TIFF **)raster_local,p0);
    img_local._4_4_ = iStack_d0;
  }
  return img_local._4_4_;
}

Assistant:

static int gtStripSeparate(TIFFRGBAImage *img, uint32_t *raster, uint32_t w,
                           uint32_t h)
{
    TIFF *tif = img->tif;
    tileSeparateRoutine put = img->put.separate;
    unsigned char *buf = NULL;
    unsigned char *p0 = NULL, *p1 = NULL, *p2 = NULL, *pa = NULL;
    uint32_t row, y, nrow, rowstoread;
    tmsize_t pos;
    tmsize_t scanline;
    uint32_t rowsperstrip, offset_row;
    uint32_t imagewidth = img->width;
    tmsize_t stripsize;
    tmsize_t bufsize;
    int32_t fromskew, toskew;
    int alpha = img->alpha;
    int ret = 1, flip;
    uint16_t colorchannels;

    stripsize = TIFFStripSize(tif);
    bufsize =
        _TIFFMultiplySSize(tif, alpha ? 4 : 3, stripsize, "gtStripSeparate");
    if (bufsize == 0)
    {
        return (0);
    }

    flip = setorientation(img);
    if (flip & FLIP_VERTICALLY)
    {
        if (w > INT_MAX)
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "Width overflow");
            return (0);
        }
        y = h - 1;
        toskew = -(int32_t)(w + w);
    }
    else
    {
        y = 0;
        toskew = -(int32_t)(w - w);
    }

    switch (img->photometric)
    {
        case PHOTOMETRIC_MINISWHITE:
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_PALETTE:
            colorchannels = 1;
            break;

        default:
            colorchannels = 3;
            break;
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_ROWSPERSTRIP, &rowsperstrip);
    scanline = TIFFScanlineSize(tif);
    fromskew = (w < imagewidth ? imagewidth - w : 0);
    for (row = 0; row < h; row += nrow)
    {
        uint32_t temp;
        rowstoread = rowsperstrip - (row + img->row_offset) % rowsperstrip;
        nrow = (row + rowstoread > h ? h - row : rowstoread);
        offset_row = row + img->row_offset;
        temp = (row + img->row_offset) % rowsperstrip + nrow;
        if (scanline > 0 && temp > (size_t)(TIFF_TMSIZE_T_MAX / scanline))
        {
            TIFFErrorExtR(tif, TIFFFileName(tif),
                          "Integer overflow in gtStripSeparate");
            return 0;
        }
        if (buf == NULL)
        {
            if (_TIFFReadEncodedStripAndAllocBuffer(
                    tif, TIFFComputeStrip(tif, offset_row, 0), (void **)&buf,
                    bufsize, temp * scanline) == (tmsize_t)(-1) &&
                (buf == NULL || img->stoponerr))
            {
                ret = 0;
                break;
            }
            p0 = buf;
            if (colorchannels == 1)
            {
                p2 = p1 = p0;
                pa = (alpha ? (p0 + 3 * stripsize) : NULL);
            }
            else
            {
                p1 = p0 + stripsize;
                p2 = p1 + stripsize;
                pa = (alpha ? (p2 + stripsize) : NULL);
            }
        }
        else if (TIFFReadEncodedStrip(tif, TIFFComputeStrip(tif, offset_row, 0),
                                      p0, temp * scanline) == (tmsize_t)(-1) &&
                 img->stoponerr)
        {
            ret = 0;
            break;
        }
        if (colorchannels > 1 &&
            TIFFReadEncodedStrip(tif, TIFFComputeStrip(tif, offset_row, 1), p1,
                                 temp * scanline) == (tmsize_t)(-1) &&
            img->stoponerr)
        {
            ret = 0;
            break;
        }
        if (colorchannels > 1 &&
            TIFFReadEncodedStrip(tif, TIFFComputeStrip(tif, offset_row, 2), p2,
                                 temp * scanline) == (tmsize_t)(-1) &&
            img->stoponerr)
        {
            ret = 0;
            break;
        }
        if (alpha)
        {
            if (TIFFReadEncodedStrip(
                    tif, TIFFComputeStrip(tif, offset_row, colorchannels), pa,
                    temp * scanline) == (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }
        }

        pos = ((row + img->row_offset) % rowsperstrip) * scanline +
              ((tmsize_t)img->col_offset * img->samplesperpixel);
        tmsize_t roffset = (tmsize_t)y * w;
        (*put)(img, raster + roffset, 0, y, w, nrow, fromskew, toskew, p0 + pos,
               p1 + pos, p2 + pos, (alpha ? (pa + pos) : NULL));
        y += ((flip & FLIP_VERTICALLY) ? -(int32_t)nrow : (int32_t)nrow);
    }

    if (flip & FLIP_HORIZONTALLY)
    {
        uint32_t line;

        for (line = 0; line < h; line++)
        {
            uint32_t *left = raster + (line * w);
            uint32_t *right = left + w - 1;

            while (left < right)
            {
                uint32_t temp = *left;
                *left = *right;
                *right = temp;
                left++;
                right--;
            }
        }
    }

    _TIFFfreeExt(img->tif, buf);
    return (ret);
}